

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  uint64_t uVar1;
  StrHash hashc;
  int iVar2;
  GCstr *pGVar3;
  MSize len;
  GCstr *pGVar4;
  uint uVar5;
  bool bVar6;
  uint local_44;
  
  uVar1 = (L->glref).ptr64;
  if (0x7ffffefe < lenx - 1) {
    if (lenx == 0) {
      return (GCstr *)(uVar1 + 0x78);
    }
    lj_err_msg(L,LJ_ERR_STROV);
  }
  len = (MSize)lenx;
  hashc = (*hash_sparse)(*(uint64_t *)(uVar1 + 0xb0),str,len);
  pGVar3 = *(GCstr **)(*(long *)(uVar1 + 0x98) + (ulong)(hashc & *(uint *)(uVar1 + 0xa0)) * 8);
  bVar6 = ((ulong)pGVar3 & 1) != 0;
  pGVar4 = pGVar3;
  if (bVar6) {
    hashc = (*hash_dense)(*(uint64_t *)(uVar1 + 0xb0),hashc,str,len);
    pGVar4 = (GCstr *)(*(ulong *)(*(long *)(uVar1 + 0x98) +
                                 (ulong)(hashc & *(uint *)(uVar1 + 0xa0)) * 8) & 0xfffffffffffffffe)
    ;
  }
  local_44 = (uint)bVar6;
  if (pGVar4 != (GCstr *)0x0) {
    uVar5 = 0;
    do {
      if ((pGVar4->hash == hashc) && (pGVar4->len == len)) {
        iVar2 = bcmp(str,pGVar4 + 1,lenx);
        if (iVar2 == 0) {
          if ((~*(byte *)(uVar1 + 0x20) & pGVar4->marked & 3) == 0) {
            return pGVar4;
          }
          pGVar4->marked = pGVar4->marked ^ 3;
          return pGVar4;
        }
        uVar5 = uVar5 + 1;
      }
      uVar5 = uVar5 + 1;
      pGVar4 = (GCstr *)(pGVar4->nextgc).gcptr64;
    } while (pGVar4 != (GCstr *)0x0);
    if (0x20 < uVar5) {
      if (((ulong)pGVar3 & 1) == 0) {
        pGVar3 = lj_str_rehash_chain(L,hashc,str,len);
        return pGVar3;
      }
      local_44 = 1;
    }
  }
  pGVar3 = lj_str_alloc(L,str,len,hashc,local_44);
  return pGVar3;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}